

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to1.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_pack4to1_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined4 *puVar4;
  uint _w;
  ulong uVar5;
  int i;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  undefined4 *puVar9;
  ulong uVar10;
  undefined4 *puVar11;
  undefined4 *puVar12;
  long lVar13;
  int p_1;
  ulong uVar14;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  uVar10 = 0;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  Mat::create(kernel_tm,_w * 0x10,inch / 4,(outch / 4) * -3 + outch,4,(Allocator *)0x0);
  pvVar1 = kernel_tm->data;
  sVar2 = kernel_tm->cstep;
  sVar3 = kernel_tm->elemsize;
  uVar5 = (ulong)_w;
  if ((int)_w < 1) {
    uVar5 = uVar10;
  }
  for (; (long)(uVar10 | 3) < (long)outch; uVar10 = uVar10 + 4) {
    pvVar7 = (void *)((uVar10 >> 2) * sVar2 * sVar3 + (long)pvVar1);
    for (uVar8 = 0; (long)(uVar8 | 3) < (long)inch; uVar8 = uVar8 + 4) {
      puVar4 = (undefined4 *)
               (((long)local_78.w * uVar8 + uVar10 * local_78.cstep) * local_78.elemsize +
               (long)local_78.data);
      for (uVar14 = 0; uVar14 != uVar5; uVar14 = uVar14 + 1) {
        puVar9 = puVar4;
        for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
          puVar11 = puVar9;
          for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 4) {
            *(undefined4 *)((long)pvVar7 + lVar13) = *puVar11;
            puVar11 = (undefined4 *)((long)puVar11 + local_78.cstep * local_78.elemsize);
          }
          puVar9 = (undefined4 *)((long)puVar9 + local_78.elemsize * (long)local_78.w);
          pvVar7 = (void *)((long)pvVar7 + 0x10);
        }
        puVar4 = puVar4 + 1;
      }
    }
  }
  pvVar1 = kernel_tm->data;
  sVar2 = kernel_tm->cstep;
  sVar3 = kernel_tm->elemsize;
  puVar4 = (undefined4 *)(local_78.elemsize * local_78.cstep * uVar10 + (long)local_78.data);
  for (; (long)uVar10 < (long)outch; uVar10 = uVar10 + 1) {
    pvVar7 = (void *)((ulong)(((uint)uVar10 & 3) + ((uint)(uVar10 >> 2) & 0x3fffffff)) *
                      sVar2 * sVar3 + (long)pvVar1);
    puVar9 = puVar4;
    for (uVar8 = 0; (long)(uVar8 | 3) < (long)inch; uVar8 = uVar8 + 4) {
      puVar11 = puVar9;
      for (uVar14 = 0; uVar14 != uVar5; uVar14 = uVar14 + 1) {
        puVar12 = puVar11;
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 4) {
          *(undefined4 *)((long)pvVar7 + lVar6) = *puVar12;
          puVar12 = (undefined4 *)((long)puVar12 + (long)local_78.w * local_78.elemsize);
        }
        puVar11 = puVar11 + 1;
        pvVar7 = (void *)((long)pvVar7 + 0x10);
      }
      puVar9 = puVar9 + (long)local_78.w * local_78.elemsize;
    }
    puVar4 = (undefined4 *)((long)puVar4 + local_78.elemsize * local_78.cstep);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack4to1_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = pb-pa-maxk-inch/pa-outch/pb
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(4 * 4 * maxk, inch / 4, outch / 4 + outch % 4);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        float* g00 = kernel_tm.channel(q / 4);

        for (int p = 0; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
    }
    for (; q < outch; q++)
    {
        const Mat k0 = kernel.channel(q);

        float* g00 = kernel_tm.channel(q / 4 + q % 4);

        for (int p = 0; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int j = 0; j < 4; j++)
                {
                    const float* k00 = k0.row(p + j);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
}